

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoTestOld(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  void **__ptr;
  void *__ptr_00;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *__ptr_01;
  long lVar4;
  int level;
  long lVar5;
  ulong uVar6;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  __ptr_01 = Gia_IsoDeriveEquivPos(p,0,fVerbose);
  if (__ptr_01 == (Vec_Ptr_t *)0x0) {
    uVar6 = 1;
  }
  else {
    uVar6 = (ulong)(uint)__ptr_01->nSize;
  }
  printf("Reduced %d outputs to %d.  ",(ulong)(uint)(p->vCos->nSize - p->nRegs),uVar6);
  level = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  if (__ptr_01 == (Vec_Ptr_t *)0x0 || fVerbose == 0) {
    if (__ptr_01 == (Vec_Ptr_t *)0x0) {
      return;
    }
    uVar3 = __ptr_01->nSize;
  }
  else {
    uVar3 = p->vCos->nSize - p->nRegs;
    uVar1 = __ptr_01->nSize;
    if (uVar3 != uVar1) {
      puts("Nontrivial classes:");
      uVar3 = uVar1;
    }
  }
  __ptr = __ptr_01->pArray;
  if ((int)uVar3 < 1) {
    if (__ptr == (void **)0x0) goto LAB_006ca110;
  }
  else {
    uVar6 = 0;
    do {
      __ptr_00 = __ptr[uVar6];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
      }
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  free(__ptr);
LAB_006ca110:
  free(__ptr_01);
  return;
}

Assistant:

void Gia_IsoTestOld( Gia_Man_t * p, int fVerbose )
{
    Vec_Ptr_t * vEquivs;
    abctime clk = Abc_Clock(); 
    vEquivs = Gia_IsoDeriveEquivPos( p, 0, fVerbose );
    printf( "Reduced %d outputs to %d.  ", Gia_ManPoNum(p), vEquivs ? Vec_PtrSize(vEquivs) : 1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && vEquivs && Gia_ManPoNum(p) != Vec_PtrSize(vEquivs) )
    {
        printf( "Nontrivial classes:\n" );
//        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    Vec_VecFreeP( (Vec_Vec_t **)&vEquivs );
}